

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O3

size_t __thiscall
cmGlobalUnixMakefileGenerator3::CountProgressMarksInTarget
          (cmGlobalUnixMakefileGenerator3 *this,cmGeneratorTarget *target,
          set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
          *emitted)

{
  TargetType TVar1;
  mapped_type *pmVar2;
  TargetDependSet *pTVar3;
  size_t sVar4;
  _Rb_tree_node_base *p_Var5;
  size_t sVar6;
  pair<std::_Rb_tree_iterator<const_cmGeneratorTarget_*>,_bool> pVar7;
  cmGeneratorTarget *local_30;
  
  local_30 = target;
  pVar7 = std::
          _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
          ::_M_insert_unique<cmGeneratorTarget_const*const&>
                    ((_Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                      *)emitted,&local_30);
  if (((undefined1  [16])pVar7 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    sVar6 = 0;
  }
  else {
    pmVar2 = std::
             map<const_cmGeneratorTarget_*,_cmGlobalUnixMakefileGenerator3::TargetProgress,_cmGeneratorTarget::StrictTargetComparison,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmGlobalUnixMakefileGenerator3::TargetProgress>_>_>
             ::operator[](&this->ProgressMap,&local_30);
    sVar6 = (long)(pmVar2->Marks).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(pmVar2->Marks).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 3;
    pTVar3 = cmGlobalGenerator::GetTargetDirectDepends((cmGlobalGenerator *)this,local_30);
    for (p_Var5 = (pTVar3->
                  super_set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>
                  )._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var5 !=
        &(pTVar3->
         super_set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>)._M_t
         ._M_impl.super__Rb_tree_header;
        p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
      TVar1 = cmGeneratorTarget::GetType(*(cmGeneratorTarget **)(p_Var5 + 1));
      if (TVar1 != INTERFACE_LIBRARY) {
        sVar4 = CountProgressMarksInTarget(this,*(cmGeneratorTarget **)(p_Var5 + 1),emitted);
        sVar6 = sVar6 + sVar4;
      }
    }
  }
  return sVar6;
}

Assistant:

size_t cmGlobalUnixMakefileGenerator3::CountProgressMarksInTarget(
  cmGeneratorTarget const* target, std::set<cmGeneratorTarget const*>& emitted)
{
  size_t count = 0;
  if (emitted.insert(target).second) {
    count = this->ProgressMap[target].Marks.size();
    TargetDependSet const& depends = this->GetTargetDirectDepends(target);
    for (cmTargetDepend const& depend : depends) {
      if (depend->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
        continue;
      }
      count += this->CountProgressMarksInTarget(depend, emitted);
    }
  }
  return count;
}